

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O0

int match_ref(size_t offset,BOOL caseless,heapframe *F,match_block_8 *mb,size_t *lengthptr)

{
  PCRE2_SPTR8 __s2;
  int iVar1;
  uint32_t cp;
  uint32_t cc;
  PCRE2_SPTR8 eptr_start;
  PCRE2_SPTR8 eptr;
  size_t length;
  PCRE2_SPTR8 p;
  size_t *lengthptr_local;
  match_block_8 *mb_local;
  heapframe *F_local;
  BOOL caseless_local;
  size_t offset_local;
  
  if ((F->offset_top <= offset) || (F->ovector[offset] == 0xffffffffffffffff)) {
    if ((mb->poptions & 0x200) != 0) {
      *lengthptr = 0;
      return 0;
    }
    return -1;
  }
  __s2 = F->eptr;
  length = (size_t)(mb->start_subject + F->ovector[offset]);
  eptr = (PCRE2_SPTR8)(F->ovector[offset + 1] - F->ovector[offset]);
  eptr_start = __s2;
  if (caseless == 0) {
    if (mb->partial == 0) {
      if (mb->end_subject + -(long)__s2 < eptr) {
        return 1;
      }
      iVar1 = memcmp((void *)length,__s2,(size_t)eptr);
      if (iVar1 != 0) {
        return -1;
      }
      eptr_start = eptr + (long)__s2;
    }
    else {
      for (; eptr != (PCRE2_SPTR8)0x0; eptr = eptr + -1) {
        if (mb->end_subject <= eptr_start) {
          return 1;
        }
        if (*(PCRE2_UCHAR8 *)length != *eptr_start) {
          return -1;
        }
        eptr_start = eptr_start + 1;
        length = length + 1;
      }
    }
  }
  else {
    for (; eptr != (PCRE2_SPTR8)0x0; eptr = eptr + -1) {
      if (mb->end_subject <= eptr_start) {
        return 1;
      }
      if (mb->lcc[*(byte *)length] != mb->lcc[*eptr_start]) {
        return -1;
      }
      length = length + 1;
      eptr_start = eptr_start + 1;
    }
  }
  *lengthptr = (long)eptr_start - (long)__s2;
  return 0;
}

Assistant:

static int
match_ref(PCRE2_SIZE offset, BOOL caseless, heapframe *F, match_block *mb,
  PCRE2_SIZE *lengthptr)
{
PCRE2_SPTR p;
PCRE2_SIZE length;
PCRE2_SPTR eptr;
PCRE2_SPTR eptr_start;

/* Deal with an unset group. The default is no match, but there is an option to
match an empty string. */

if (offset >= Foffset_top || Fovector[offset] == PCRE2_UNSET)
  {
  if ((mb->poptions & PCRE2_MATCH_UNSET_BACKREF) != 0)
    {
    *lengthptr = 0;
    return 0;      /* Match */
    }
  else return -1;  /* No match */
  }

/* Separate the caseless and UTF cases for speed. */

eptr = eptr_start = Feptr;
p = mb->start_subject + Fovector[offset];
length = Fovector[offset+1] - Fovector[offset];

if (caseless)
  {
#if defined SUPPORT_UNICODE
  BOOL utf = (mb->poptions & PCRE2_UTF) != 0;

  if (utf || (mb->poptions & PCRE2_UCP) != 0)
    {
    PCRE2_SPTR endptr = p + length;

    /* Match characters up to the end of the reference. NOTE: the number of
    code units matched may differ, because in UTF-8 there are some characters
    whose upper and lower case codes have different numbers of bytes. For
    example, U+023A (2 bytes in UTF-8) is the upper case version of U+2C65 (3
    bytes in UTF-8); a sequence of 3 of the former uses 6 bytes, as does a
    sequence of two of the latter. It is important, therefore, to check the
    length along the reference, not along the subject (earlier code did this
    wrong). UCP without uses Unicode properties but without UTF encoding. */

    while (p < endptr)
      {
      uint32_t c, d;
      const ucd_record *ur;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */

      if (utf)
        {
        GETCHARINC(c, eptr);
        GETCHARINC(d, p);
        }
      else
        {
        c = *eptr++;
        d = *p++;
        }

      ur = GET_UCD(d);
      if (c != d && c != (uint32_t)((int)d + ur->other_case))
        {
        const uint32_t *pp = PRIV(ucd_caseless_sets) + ur->caseset;
        for (;;)
          {
          if (c < *pp) return -1;  /* No match */
          if (c == *pp++) break;
          }
        }
      }
    }
  else
#endif

  /* Not in UTF or UCP mode */
    {
    for (; length > 0; length--)
      {
      uint32_t cc, cp;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      cc = UCHAR21TEST(eptr);
      cp = UCHAR21TEST(p);
      if (TABLE_GET(cp, mb->lcc, cp) != TABLE_GET(cc, mb->lcc, cc))
        return -1;  /* No match */
      p++;
      eptr++;
      }
    }
  }

/* In the caseful case, we can just compare the code units, whether or not we
are in UTF and/or UCP mode. When partial matching, we have to do this unit by
unit. */

else
  {
  if (mb->partial != 0)
    {
    for (; length > 0; length--)
      {
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      if (UCHAR21INCTEST(p) != UCHAR21INCTEST(eptr)) return -1;  /* No match */
      }
    }

  /* Not partial matching */

  else
    {
    if ((PCRE2_SIZE)(mb->end_subject - eptr) < length) return 1; /* Partial */
    if (memcmp(p, eptr, CU2BYTES(length)) != 0) return -1;  /* No match */
    eptr += length;
    }
  }

*lengthptr = eptr - eptr_start;
return 0;  /* Match */
}